

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O2

bool __thiscall
psy::C::Parser::parseDirectDeclaratorSuffix
          (Parser *this,DeclaratorSyntax **decltor,DeclarationContext declCtx,
          DeclaratorForm decltorForm,SpecifierListSyntax *attrList,DeclaratorSyntax *innerDecltor)

{
  SyntaxKind SVar1;
  DeclaratorSyntax *pDVar2;
  bool bVar3;
  int iVar4;
  SyntaxToken *pSVar5;
  ParameterSuffixSyntax *pPVar6;
  IndexType IVar7;
  ArrayOrFunctionDeclaratorSyntax *pAVar8;
  undefined4 extraout_var;
  SubscriptSuffixSyntax *pSVar9;
  undefined4 extraout_var_00;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar10;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> **specList;
  ParameterSuffixSyntax *funcDecltorSfx;
  anon_class_8_1_8991fb9c checkDialect;
  SyntaxKind local_42;
  SyntaxTree *local_40;
  SpecifierListSyntax *local_38;
  
  checkDialect.this = this;
  local_38 = attrList;
  pSVar5 = peek(this,1);
  local_40 = (SyntaxTree *)innerDecltor;
  if (pSVar5->syntaxK_ == OpenBracketToken) {
    pSVar9 = makeNode<psy::C::SubscriptSuffixSyntax>(this);
    IVar7 = consume(this);
    pSVar9->openBracketTkIdx_ = IVar7;
    pSVar5 = peek(this,1);
    SVar1 = pSVar5->syntaxK_;
    if (SVar1 != CloseBracketToken) {
      if ((SVar1 == KeywordAlias___const) || (SVar1 == KeywordAlias___restrict)) {
LAB_002e996b:
        parseDirectDeclaratorSuffix::anon_class_8_1_8991fb9c::operator()(&checkDialect);
        if (declCtx != Parameter) {
          DiagnosticsReporter::UnexpectedStaticOrTypeQualifiersInArrayDeclarator
                    (&this->diagReporter_);
          skipTo(this,CloseBracketToken);
          goto LAB_002e9b29;
        }
        bVar3 = parseTypeQualifiersAndAttributes(this,&pSVar9->qualsAndAttrs1_);
        if (!bVar3) goto LAB_002e9b29;
        pSVar5 = peek(this,1);
        if (pSVar5->syntaxK_ != Keyword_static) {
          if (pSVar5->syntaxK_ == AsteriskToken) goto LAB_002e99ad;
          goto LAB_002e9a38;
        }
LAB_002e99d8:
        parseDirectDeclaratorSuffix::anon_class_8_1_8991fb9c::operator()(&checkDialect);
        if (declCtx != Parameter) {
          DiagnosticsReporter::UnexpectedStaticOrTypeQualifiersInArrayDeclarator
                    (&this->diagReporter_);
LAB_002e9b4a:
          skipTo(this,CloseBracketToken);
          goto LAB_002e9b29;
        }
        IVar7 = consume(this);
        pSVar9->staticKwTkIdx_ = IVar7;
        pSVar5 = peek(this,1);
        SVar1 = pSVar5->syntaxK_;
        if (((((ulong)SVar1 < 0x3e) && ((0x2004000400000000U >> ((ulong)SVar1 & 0x3f) & 1) != 0)) ||
            (SVar1 == KeywordAlias___attribute)) &&
           (bVar3 = parseTypeQualifiersAndAttributes(this,&pSVar9->qualsAndAttrs2_), !bVar3))
        goto LAB_002e9b29;
      }
      else {
        if (SVar1 == Keyword_static) goto LAB_002e99d8;
        if (((SVar1 == ENDof_KeywordOrPunctuatorToken) || (SVar1 == KeywordAlias___attribute)) ||
           (SVar1 == Keyword__Atomic)) goto LAB_002e996b;
        if (SVar1 == AsteriskToken) {
          parseDirectDeclaratorSuffix::anon_class_8_1_8991fb9c::operator()(&checkDialect);
          if (declCtx == Parameter) {
LAB_002e99ad:
            IVar7 = consume(this);
            pSVar9->asteriskTkIdx_ = IVar7;
            goto LAB_002e9a4d;
          }
          DiagnosticsReporter::UnexpectedPointerInArrayDeclarator(&this->diagReporter_);
          goto LAB_002e9b4a;
        }
      }
LAB_002e9a38:
      bVar3 = parseExpressionWithPrecedenceAssignment(this,&pSVar9->expr_);
      if (!bVar3) {
LAB_002e9b29:
        skipTo(this,CloseBracketToken);
        return false;
      }
    }
LAB_002e9a4d:
    bVar3 = matchOrSkipTo(this,CloseBracketToken,&pSVar9->closeBracketTkIdx_);
    if (!bVar3) {
      return false;
    }
    funcDecltorSfx = (ParameterSuffixSyntax *)CONCAT62(funcDecltorSfx._2_6_,0x415);
    pAVar8 = makeNode<psy::C::ArrayOrFunctionDeclaratorSyntax,psy::C::SyntaxKind>
                       (this,(SyntaxKind *)&funcDecltorSfx);
    *decltor = &pAVar8->super_DeclaratorSyntax;
    iVar4 = (*(pAVar8->super_DeclaratorSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0x56])
                      (pAVar8);
    *(SubscriptSuffixSyntax **)(CONCAT44(extraout_var_00,iVar4) + 0x28) = pSVar9;
  }
  else {
    if (pSVar5->syntaxK_ != OpenParenToken) {
      return true;
    }
    pPVar6 = makeNode<psy::C::ParameterSuffixSyntax>(this);
    funcDecltorSfx = pPVar6;
    IVar7 = consume(this);
    pPVar6->openParenTkIdx_ = IVar7;
    bVar3 = parseParameterDeclarationListAndOrEllipsis(this,&funcDecltorSfx);
    if (!bVar3) {
      return false;
    }
    bVar3 = match(this,CloseParenToken,&pPVar6->closeParenTkIdx_);
    if (!bVar3) {
      return false;
    }
    pSVar5 = peek(this,1);
    if (pSVar5->syntaxK_ == Keyword_ExtPSY_omission) {
      IVar7 = consume(this);
      pPVar6->psyOmitTkIdx_ = IVar7;
    }
    local_42 = FunctionDeclarator;
    pAVar8 = makeNode<psy::C::ArrayOrFunctionDeclaratorSyntax,psy::C::SyntaxKind>(this,&local_42);
    *decltor = &pAVar8->super_DeclaratorSyntax;
    iVar4 = (*(pAVar8->super_DeclaratorSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0x56])
                      (pAVar8);
    *(ParameterSuffixSyntax **)(CONCAT44(extraout_var,iVar4) + 0x28) = pPVar6;
  }
  pDVar2 = *decltor;
  pDVar2[1].super_SyntaxNode.super_Managed._vptr_Managed = (_func_int **)local_38;
  pDVar2[1].super_SyntaxNode.tree_ = local_40;
  specList = (SyntaxNodePlainList<psy::C::SpecifierSyntax_*> **)(pDVar2 + 2);
  pSVar5 = peek(this,1);
  if (pSVar5->syntaxK_ != KeywordAlias___attribute) {
    if (pSVar5->syntaxK_ != KeywordAlias___asm) goto LAB_002e9b63;
    funcDecltorSfx = (ParameterSuffixSyntax *)0x0;
    bVar3 = parseExtGNU_AsmLabel_AtFirst(this,(SpecifierSyntax **)&funcDecltorSfx);
    if (!bVar3) {
      return false;
    }
    pSVar10 = makeNode<psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>,psy::C::SpecifierSyntax*&>
                        (this,(SpecifierSyntax **)&funcDecltorSfx);
    *specList = pSVar10;
    pSVar5 = peek(this,1);
    if (pSVar5->syntaxK_ != KeywordAlias___attribute) goto LAB_002e9b63;
    specList = &(pSVar10->
                super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                ).
                super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                .next;
  }
  bVar3 = parseExtGNU_AttributeSpecifierList_AtFirst(this,specList);
  if (!bVar3) {
    return false;
  }
LAB_002e9b63:
  pSVar5 = peek(this,1);
  if ((pSVar5->syntaxK_ != OpenParenToken) && (pSVar5->syntaxK_ != OpenBracketToken)) {
    return true;
  }
  bVar3 = parseDirectDeclaratorSuffix
                    (this,decltor,declCtx,decltorForm,(SpecifierListSyntax *)0x0,*decltor);
  return bVar3;
}

Assistant:

bool Parser::parseDirectDeclaratorSuffix(DeclaratorSyntax*& decltor,
                                         DeclarationContext declCtx,
                                         DeclaratorForm decltorForm,
                                         SpecifierListSyntax* attrList,
                                         DeclaratorSyntax* innerDecltor)
{
    auto validateContext =
            [this, declCtx] (void (Parser::DiagnosticsReporter::*report)()) {
                if (declCtx != DeclarationContext::Parameter) {
                    ((diagReporter_).*(report))();
                    skipTo(SyntaxKind::CloseBracketToken);
                    return false;
                }
                return true;
            };

    auto checkDialect =
            [this] () {
                if (tree_->dialect().std() < LanguageDialect::Std::C99) {
                    diagReporter_.ExpectedFeature(
                            "C99 array declarators with `*', `static', and type-qualifiers "
                            "within function parameters");
                }
            };

    switch (peek().kind()) {
        case SyntaxKind::OpenParenToken: {
            auto funcDecltorSfx = makeNode<ParameterSuffixSyntax>();
            funcDecltorSfx->openParenTkIdx_ = consume();
            if (!parseParameterDeclarationListAndOrEllipsis(funcDecltorSfx)
                    || !match(SyntaxKind::CloseParenToken, &funcDecltorSfx->closeParenTkIdx_))
                return false;

            if (peek().kind() == SyntaxKind::Keyword_ExtPSY_omission)
                funcDecltorSfx->psyOmitTkIdx_ = consume();

            decltor = makeNode<ArrayOrFunctionDeclaratorSyntax>(SyntaxKind::FunctionDeclarator);
            decltor->asArrayOrFunctionDeclarator()->suffix_ = funcDecltorSfx;
            break;
        }

        case SyntaxKind::OpenBracketToken: {
            auto arrDecltorSx = makeNode<SubscriptSuffixSyntax>();
            arrDecltorSx->openBracketTkIdx_ = consume();
            switch (peek().kind()) {
                case SyntaxKind::CloseBracketToken:
                    break;

                case SyntaxKind::AsteriskToken:
                    checkDialect();
                    if (!validateContext(&Parser::DiagnosticsReporter::
                                         UnexpectedPointerInArrayDeclarator)) {
                        skipTo(SyntaxKind::CloseBracketToken);
                        return false;
                    }
                    arrDecltorSx->asteriskTkIdx_ = consume();
                    break;

                case SyntaxKind::Keyword_const:
                case SyntaxKind::Keyword_volatile:
                case SyntaxKind::Keyword_restrict:
                case SyntaxKind::Keyword__Atomic:
                case SyntaxKind::Keyword_ExtGNU___attribute__: {
                    checkDialect();
                    if (!validateContext(&Parser::DiagnosticsReporter::
                                         UnexpectedStaticOrTypeQualifiersInArrayDeclarator)
                            || !parseTypeQualifiersAndAttributes(arrDecltorSx->qualsAndAttrs1_)) {
                        skipTo(SyntaxKind::CloseBracketToken);
                        return false;
                    }

                    auto tkK = peek().kind();
                    if (tkK == SyntaxKind::AsteriskToken) {
                        arrDecltorSx->asteriskTkIdx_ = consume();
                        break;
                    }
                    else if (tkK != SyntaxKind::Keyword_static) {
                        if (!parseExpressionWithPrecedenceAssignment(arrDecltorSx->expr_)) {
                            skipTo(SyntaxKind::CloseBracketToken);
                            return false;
                        }
                        break;
                    }
                    [[fallthrough]];
                }

                case SyntaxKind::Keyword_static:
                    checkDialect();
                    if (!validateContext(&Parser::DiagnosticsReporter::
                                         UnexpectedStaticOrTypeQualifiersInArrayDeclarator)) {
                        skipTo(SyntaxKind::CloseBracketToken);
                        return false;
                    }

                    arrDecltorSx->staticKwTkIdx_ = consume();
                    switch (peek().kind()) {
                        case SyntaxKind::Keyword_const:
                        case SyntaxKind::Keyword_volatile:
                        case SyntaxKind::Keyword_restrict:
                        case SyntaxKind::Keyword_ExtGNU___attribute__:
                            if (!parseTypeQualifiersAndAttributes(arrDecltorSx->qualsAndAttrs2_)) {
                                skipTo(SyntaxKind::CloseBracketToken);
                                return false;
                            }
                            [[fallthrough]];

                        default:
                            break;
                    }
                    [[fallthrough]];

                default:
                    if (!parseExpressionWithPrecedenceAssignment(arrDecltorSx->expr_)) {
                        skipTo(SyntaxKind::CloseBracketToken);
                        return false;
                    }
                    break;
            }

            if (!matchOrSkipTo(SyntaxKind::CloseBracketToken, &arrDecltorSx->closeBracketTkIdx_))
                return false;

            decltor = makeNode<ArrayOrFunctionDeclaratorSyntax>(SyntaxKind::ArrayDeclarator);
            decltor->asArrayOrFunctionDeclarator()->suffix_ = arrDecltorSx;
            break;
        }

        default:
            return true;
    }

    auto arrayOrFuncDecltor = static_cast<ArrayOrFunctionDeclaratorSyntax*>(decltor);
    arrayOrFuncDecltor->attrs1_ = attrList;
    arrayOrFuncDecltor->innerDecltor_ = innerDecltor;

    SpecifierListSyntax** specList_cur = &arrayOrFuncDecltor->attrs2_;

    switch (peek().kind()) {
        case SyntaxKind::Keyword_ExtGNU___asm__: {
            SpecifierSyntax* spec = nullptr;
            if (!parseExtGNU_AsmLabel_AtFirst(spec))
                return false;

            *specList_cur = makeNode<SpecifierListSyntax>(spec);
            specList_cur = &(*specList_cur)->next;

            if (peek().kind() != SyntaxKind::Keyword_ExtGNU___attribute__)
                break;
            [[fallthrough]];
        }

        case SyntaxKind::Keyword_ExtGNU___attribute__:
            if (!parseExtGNU_AttributeSpecifierList_AtFirst(*specList_cur))
                return false;
            break;

        default:
            break;
    }

    switch (peek().kind()) {
        case SyntaxKind::OpenParenToken:
        case SyntaxKind::OpenBracketToken: {
            innerDecltor = decltor;
            return parseDirectDeclaratorSuffix(decltor,
                                               declCtx,
                                               decltorForm,
                                               nullptr,
                                               innerDecltor);
        }

        default:
            return true;
    }

    return true;
}